

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BGIPSolution.cpp
# Opt level: O1

void __thiscall BGIPSolution::SetNrDesiredSolutions(BGIPSolution *this,size_t n)

{
  _List_base<boost::shared_ptr<JPPVValuePair>,_std::allocator<boost::shared_ptr<JPPVValuePair>_>_>
  local_38;
  size_t local_20;
  
  this->_m_nrDesiredSolutions = n;
  this->_m_useFixedCapacityPriorityQueue = n != 0x7fffffff;
  if (n != 0x7fffffff) {
    local_38._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_38;
    local_38._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_38;
    local_38._M_impl._M_node._M_size = 0;
    local_20 = n;
    std::__cxx11::
    list<boost::shared_ptr<JPPVValuePair>,_std::allocator<boost::shared_ptr<JPPVValuePair>_>_>::
    _M_move_assign(&(this->_m_qFixedK)._m_l,&local_38);
    (this->_m_qFixedK)._m_capacity = local_20;
    std::__cxx11::
    _List_base<boost::shared_ptr<JPPVValuePair>,_std::allocator<boost::shared_ptr<JPPVValuePair>_>_>
    ::_M_clear(&local_38);
    local_20 = this->_m_nrDesiredSolutions;
    local_38._M_impl._M_node._M_size = 0;
    local_38._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_38;
    local_38._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_38;
    std::__cxx11::
    list<boost::shared_ptr<PartialJPDPValuePair>,_std::allocator<boost::shared_ptr<PartialJPDPValuePair>_>_>
    ::_M_move_assign(&(this->_m_qpFixedK)._m_l,&local_38);
    (this->_m_qpFixedK)._m_capacity = local_20;
    std::__cxx11::
    _List_base<boost::shared_ptr<PartialJPDPValuePair>,_std::allocator<boost::shared_ptr<PartialJPDPValuePair>_>_>
    ::_M_clear((_List_base<boost::shared_ptr<PartialJPDPValuePair>,_std::allocator<boost::shared_ptr<PartialJPDPValuePair>_>_>
                *)&local_38);
  }
  return;
}

Assistant:

void BGIPSolution::SetNrDesiredSolutions(size_t n) 
{
    _m_nrDesiredSolutions =  n;
    if(_m_nrDesiredSolutions==INT_MAX)
        _m_useFixedCapacityPriorityQueue=false;
    else
        _m_useFixedCapacityPriorityQueue=true;

    if(_m_useFixedCapacityPriorityQueue)
    {
        _m_qFixedK=FixedCapacityPriorityQueue<boost::shared_ptr<JPPVValuePair> >(_m_nrDesiredSolutions);
        _m_qpFixedK=FixedCapacityPriorityQueue<boost::shared_ptr<PartialJPDPValuePair> >(_m_nrDesiredSolutions);
    }
}